

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint_Loop.cc
# Opt level: O0

void __thiscall
RigidBodyDynamics::LoopConstraint::calcVelocityError
          (LoopConstraint *this,Model *model,double time,VectorNd *Q,VectorNd *QDot,MatrixNd *GSys,
          VectorNd *derrSysUpd,ConstraintCache *cache,bool updateKinematics)

{
  bool bVar1;
  Scalar *pSVar2;
  ulong uVar3;
  Index IVar4;
  CoeffReturnType pdVar5;
  CoeffReturnType pdVar6;
  long in_RDI;
  uint j;
  uint i;
  double in_stack_ffffffffffffff88;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  vector<bool,_std::allocator<bool>_> *this_00;
  reference in_stack_ffffffffffffffb0;
  uint local_40;
  
  for (local_40 = 0; this_00 = (vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffffb0._M_p
      , local_40 < *(uint *)(in_RDI + 0x30); local_40 = local_40 + 1) {
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (in_stack_ffffffffffffff90,(Index)in_stack_ffffffffffffff88);
    *pSVar2 = 0.0;
    in_stack_ffffffffffffffb0 =
         std::vector<bool,_std::allocator<bool>_>::operator[]
                   (this_00,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    bVar1 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffffb0);
    if (bVar1) {
      for (in_stack_ffffffffffffffac = 0; uVar3 = (ulong)in_stack_ffffffffffffffac,
          IVar4 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x80b201)
          , (long)uVar3 < IVar4; in_stack_ffffffffffffffac = in_stack_ffffffffffffffac + 1) {
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                            in_stack_ffffffffffffff90,(Index)in_stack_ffffffffffffff88,0x80b232);
        in_stack_ffffffffffffff88 = *pdVar5;
        pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                            in_stack_ffffffffffffff90,(Index)in_stack_ffffffffffffff88);
        in_stack_ffffffffffffff90 =
             (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)*pdVar6;
        pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           (in_stack_ffffffffffffff90,(Index)in_stack_ffffffffffffff88);
        *pSVar2 = in_stack_ffffffffffffff88 * (double)in_stack_ffffffffffffff90 + *pSVar2;
      }
    }
  }
  return;
}

Assistant:

void LoopConstraint::calcVelocityError(  Model &model,
                            const double time,
                            const Math::VectorNd &Q,
                            const Math::VectorNd &QDot,
                            const Math::MatrixNd &GSys,
                            Math::VectorNd &derrSysUpd,
                            ConstraintCache &cache,
                            bool updateKinematics)
{
  //SimpleMath cannot handle multiplying a block matrix by a vector
  //Using a for loop here to maintain backwards compatibility.
  //Rant: all of this ugliness for a dot product! Does anyone even use
  //      SimpleMath?

  //derrSysUpd.block(rowInSystem,0,sizeOfConstraint,1) =
  //    GSys.block(rowInSystem,0,sizeOfConstraint,GSys.cols())*QDot;

  for(unsigned int i=0; i<sizeOfConstraint;++i){
    derrSysUpd[rowInSystem+i] = 0;
    if(velocityConstraint[i]){
      for(unsigned int j=0; j<GSys.cols();++j){
        derrSysUpd[rowInSystem+i] +=
             GSys(rowInSystem+i,j)*QDot[j];
      }
    }
  }

}